

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  bool bVar1;
  char *pcVar2;
  char_t *src;
  undefined7 extraout_var;
  xpath_variable *pxVar3;
  uint uVar4;
  char cVar5;
  xpath_variable *this_00;
  
  cVar5 = *name;
  if (cVar5 == '\0') {
    pxVar3 = (xpath_variable *)0x0;
  }
  else {
    pcVar2 = name + 1;
    uVar4 = 0;
    do {
      uVar4 = ((int)cVar5 + uVar4) * 0x401;
      uVar4 = uVar4 >> 6 ^ uVar4;
      cVar5 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar5 != '\0');
    pxVar3 = (xpath_variable *)(ulong)(uVar4 * 9);
  }
  uVar4 = ((uint)((ulong)pxVar3 >> 0xb) ^ (uint)pxVar3) & 0x3f;
  this_00 = this->_data[uVar4];
  do {
    if (this_00 == (xpath_variable *)0x0) {
LAB_0035260d:
      if ((this_00 == (xpath_variable *)0x0) &&
         (pxVar3 = impl::anon_unknown_0::new_xpath_variable(type,name),
         pxVar3 != (xpath_variable *)0x0)) {
        pxVar3->_next = this->_data[uVar4];
        this->_data[uVar4] = pxVar3;
      }
      return pxVar3;
    }
    src = xpath_variable::name(this_00);
    bVar1 = impl::anon_unknown_0::strequal(src,name);
    pxVar3 = (xpath_variable *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      pxVar3 = (xpath_variable *)0x0;
      if (this_00->_type == type) {
        pxVar3 = this_00;
      }
      goto LAB_0035260d;
    }
    this_00 = this_00->_next;
  } while( true );
}

Assistant:

PUGI_IMPL_FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : 0;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}